

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O0

size_t __thiscall
libDAI::JTree::findEfficientTree(JTree *this,VarSet *ns,DEdgeVec *Tree,size_t PreviousRoot)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  FRegion *pFVar4;
  pointer pDVar5;
  size_type sVar6;
  reference pvVar7;
  size_t in_RCX;
  RegionGraph *in_RDX;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<libDAI::UEdge>,_bool> pVar8;
  pair<std::_Rb_tree_const_iterator<libDAI::DEdge>,_bool> pVar9;
  const_iterator e_4;
  size_t subTreeSize;
  const_iterator e_3;
  size_t pos_1;
  size_t e_2;
  size_t pos;
  size_t e_1;
  const_iterator n;
  set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_> subTree;
  VarSet nsrem;
  DEdgeVec newTree;
  const_iterator e;
  Graph oldTree;
  size_t val;
  size_t alpha;
  size_t maxalpha;
  size_t maxval;
  VarSet *in_stack_fffffffffffffcc8;
  RegionGraph *in_stack_fffffffffffffcd0;
  __normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
  in_stack_fffffffffffffcd8;
  __normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
  in_stack_fffffffffffffce0;
  __normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
  in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  VarSet *in_stack_fffffffffffffd60;
  VarSet *in_stack_fffffffffffffd68;
  __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
  local_1f0;
  size_type local_1e8;
  DEdge *local_1e0;
  DEdge *local_1d8;
  DEdge *local_1d0;
  __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
  local_1c8;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  size_t in_stack_fffffffffffffe50;
  Graph *in_stack_fffffffffffffe58;
  size_type local_198;
  size_t local_178;
  size_type local_160;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_148 [11];
  vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> local_f0;
  DEdge *local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  UEdge local_c0;
  DEdge *local_b0;
  __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
  local_a8 [9];
  VarSet local_60;
  size_t local_40;
  ulong local_38;
  size_t local_30;
  size_t local_28;
  size_t local_20;
  RegionGraph *local_18;
  
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  while( true ) {
    uVar1 = local_38;
    (**(code **)(*in_RDI + 0x20))();
    sVar3 = RegionGraph::nr_ORs((RegionGraph *)0xb65241);
    if (sVar3 <= uVar1) break;
    (**(code **)(*in_RDI + 0x20))();
    pFVar4 = RegionGraph::OR(in_stack_fffffffffffffcd0,(long)in_stack_fffffffffffffcc8);
    TFactor<double>::vars(&pFVar4->super_Factor);
    VarSet::operator&(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    sVar3 = VarSet::stateSpace(&local_60);
    VarSet::~VarSet((VarSet *)0xb652d2);
    if (local_28 < sVar3) {
      local_30 = local_38;
      local_28 = sVar3;
    }
    local_38 = local_38 + 1;
    local_40 = sVar3;
  }
  std::set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>::set
            ((set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_> *)
             0xb65364);
  local_a8[0]._M_current =
       (DEdge *)std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::begin
                          ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                           in_stack_fffffffffffffcc8);
  while( true ) {
    local_b0 = (DEdge *)std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::end
                                  ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                                   in_stack_fffffffffffffcc8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                        *)in_stack_fffffffffffffcd0,
                       (__normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                        *)in_stack_fffffffffffffcc8);
    if (!bVar2) break;
    pDVar5 = __gnu_cxx::
             __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
             ::operator->(local_a8);
    sVar3 = pDVar5->n1;
    pDVar5 = __gnu_cxx::
             __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
             ::operator->(local_a8);
    UEdge::UEdge(&local_c0,sVar3,pDVar5->n2);
    pVar8 = std::set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>::
            insert((set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (value_type *)in_stack_fffffffffffffce8._M_current);
    local_d0 = (_Base_ptr)pVar8.first._M_node;
    local_c8 = pVar8.second;
    local_d8 = (DEdge *)__gnu_cxx::
                        __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                        ::operator++(in_stack_fffffffffffffcd8._M_current,
                                     (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  }
  GrowRootedTree(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  (**(code **)(*in_RDI + 0x20))();
  pFVar4 = RegionGraph::OR(in_stack_fffffffffffffcd0,(long)in_stack_fffffffffffffcc8);
  TFactor<double>::vars(&pFVar4->super_Factor);
  VarSet::operator/(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>::set
            ((set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_> *)
             0xb65527);
  VarSet::begin(in_stack_fffffffffffffcc8);
  __gnu_cxx::
  __normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>::
  __normal_iterator<libDAI::Var*>
            ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              *)in_stack_fffffffffffffcd0,
             (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              *)in_stack_fffffffffffffcc8);
  do {
    VarSet::end(in_stack_fffffffffffffcc8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_fffffffffffffcd0,
                       (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_fffffffffffffcc8);
    if (!bVar2) {
      if ((local_20 != 0xffffffffffffffff) && (local_20 != local_30)) {
        local_198 = 0;
        while ((sVar6 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size(&local_f0),
               local_198 != sVar6 &&
               (pvVar7 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                                   (&local_f0,local_198), pvVar7->n2 != local_20))) {
          local_198 = local_198 + 1;
        }
        std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[](&local_f0,local_198);
        std::set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>::insert
                  ((set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8._M_current);
        pvVar7 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                           (&local_f0,local_198);
        sVar3 = pvVar7->n1;
        for (; local_198 != 0; local_198 = local_198 - 1) {
          pvVar7 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                             (&local_f0,local_198 - 1);
          if (pvVar7->n2 == sVar3) {
            std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                      (&local_f0,local_198 - 1);
            pVar9 = std::
                    set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>::
                    insert((set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>
                            *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                           in_stack_fffffffffffffce8._M_current);
            local_1c0 = (_Base_ptr)pVar9.first._M_node;
            in_stack_fffffffffffffcf7 = pVar9.second;
            local_1b8 = in_stack_fffffffffffffcf7;
            pvVar7 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                               (&local_f0,local_198 - 1);
            sVar3 = pvVar7->n1;
          }
        }
      }
      std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::clear
                ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)0xb659e9);
      local_1d0 = (DEdge *)std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::begin
                                     ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                                      in_stack_fffffffffffffcc8);
      __gnu_cxx::
      __normal_iterator<libDAI::DEdge_const*,std::vector<libDAI::DEdge,std::allocator<libDAI::DEdge>>>
      ::__normal_iterator<libDAI::DEdge*>
                ((__normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                  *)in_stack_fffffffffffffcd0,
                 (__normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                  *)in_stack_fffffffffffffcc8);
      while( true ) {
        local_1d8 = (DEdge *)std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::end
                                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                                        in_stack_fffffffffffffcc8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                            *)in_stack_fffffffffffffcd0,
                           (__normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                            *)in_stack_fffffffffffffcc8);
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
        ::operator*(&local_1c8);
        in_stack_fffffffffffffce8._M_current =
             (DEdge *)std::
                      set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>::
                      count(in_stack_fffffffffffffce0._M_current,
                            in_stack_fffffffffffffcd8._M_current);
        if (in_stack_fffffffffffffce8._M_current != (DEdge *)0x0) {
          in_stack_fffffffffffffce0._M_current = (DEdge *)local_18;
          __gnu_cxx::
          __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
          ::operator*(&local_1c8);
          std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::push_back
                    ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                     in_stack_fffffffffffffce0._M_current,in_stack_fffffffffffffcd8._M_current);
        }
        local_1e0 = (DEdge *)__gnu_cxx::
                             __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                             ::operator++(in_stack_fffffffffffffcd8._M_current,
                                          (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
      }
      local_1e8 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size
                            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)local_18);
      std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::begin
                ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)in_stack_fffffffffffffcc8)
      ;
      __gnu_cxx::
      __normal_iterator<libDAI::DEdge_const*,std::vector<libDAI::DEdge,std::allocator<libDAI::DEdge>>>
      ::__normal_iterator<libDAI::DEdge*>
                ((__normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                  *)in_stack_fffffffffffffcd0,
                 (__normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                  *)in_stack_fffffffffffffcc8);
      while( true ) {
        std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::end
                  ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                   in_stack_fffffffffffffcc8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                            *)in_stack_fffffffffffffcd0,
                           (__normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                            *)in_stack_fffffffffffffcc8);
        if (!bVar2) break;
        std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::begin
                  ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                   in_stack_fffffffffffffcc8);
        std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::end
                  ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                   in_stack_fffffffffffffcc8);
        __gnu_cxx::
        __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
        ::operator*(&local_1f0);
        in_stack_fffffffffffffcd8 =
             std::
             find<__gnu_cxx::__normal_iterator<libDAI::DEdge*,std::vector<libDAI::DEdge,std::allocator<libDAI::DEdge>>>,libDAI::DEdge>
                       (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                        in_stack_fffffffffffffcd8._M_current);
        std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::end
                  ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                   in_stack_fffffffffffffcc8);
        bVar2 = __gnu_cxx::operator==
                          ((__normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                            *)in_stack_fffffffffffffcd0,
                           (__normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                            *)in_stack_fffffffffffffcc8);
        if (bVar2) {
          in_stack_fffffffffffffcd0 = local_18;
          __gnu_cxx::
          __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
          ::operator*(&local_1f0);
          std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::push_back
                    ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                     in_stack_fffffffffffffce0._M_current,in_stack_fffffffffffffcd8._M_current);
        }
        __gnu_cxx::
        __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
        ::operator++((__normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                      *)in_stack_fffffffffffffcd8._M_current,
                     (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
      }
      sVar6 = local_1e8;
      std::set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>::~set
                ((set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_> *)
                 0xb65c22);
      VarSet::~VarSet((VarSet *)0xb65c2f);
      std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::~vector
                ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                 in_stack_fffffffffffffce0._M_current);
      std::set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>::~set
                ((set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_> *)
                 0xb65c49);
      return sVar6;
    }
    for (local_160 = 0;
        sVar6 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size(&local_f0),
        local_160 != sVar6; local_160 = local_160 + 1) {
      (**(code **)(*in_RDI + 0x20))();
      std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[](&local_f0,local_160);
      pFVar4 = RegionGraph::OR(in_stack_fffffffffffffcd0,(long)in_stack_fffffffffffffcc8);
      TFactor<double>::vars(&pFVar4->super_Factor);
      __gnu_cxx::
      __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
      ::operator*(local_148);
      bVar2 = VarSet::operator&&((VarSet *)in_stack_fffffffffffffce0._M_current,
                                 (Var *)in_stack_fffffffffffffcd8._M_current);
      if (bVar2) break;
    }
    std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[](&local_f0,local_160);
    std::set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>::insert
              ((set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_> *)
               CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffce8._M_current);
    pvVar7 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                       (&local_f0,local_160);
    local_178 = pvVar7->n1;
    for (; local_160 != 0; local_160 = local_160 - 1) {
      pvVar7 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                         (&local_f0,local_160 - 1);
      if (pvVar7->n2 == local_178) {
        std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                  (&local_f0,local_160 - 1);
        std::set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>::insert
                  ((set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8._M_current);
        pvVar7 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                           (&local_f0,local_160 - 1);
        local_178 = pvVar7->n1;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
    ::operator++((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                  *)in_stack_fffffffffffffcd8._M_current,
                 (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  } while( true );
}

Assistant:

size_t JTree::findEfficientTree( const VarSet& ns, DEdgeVec &Tree, size_t PreviousRoot ) const {
        // find new root clique (the one with maximal statespace overlap with ns)
        size_t maxval = 0, maxalpha = 0;
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
            size_t val = (ns & grm().OR(alpha).vars()).stateSpace();
            if( val > maxval ) {
                maxval = val;
                maxalpha = alpha;
            }
        }

    //  for( size_t e = 0; e < _RTree.size(); e++ )
    //      cout << grm().OR(_RTree[e].n1).vars() << "->" << grm().OR(_RTree[e].n2).vars() << ",  ";
    //  cout << endl;
        // grow new tree
        Graph oldTree;
        for( DEdgeVec::const_iterator e = _RTree.begin(); e != _RTree.end(); e++ )
            oldTree.insert( UEdge(e->n1, e->n2) );
        DEdgeVec newTree = GrowRootedTree( oldTree, maxalpha );
    //  cout << ns << ": ";
    //  for( size_t e = 0; e < newTree.size(); e++ )
    //      cout << grm().OR(newTree[e].n1).vars() << "->" << grm().OR(newTree[e].n2).vars() << ",  ";
    //  cout << endl;
        
        // identify subtree that contains variables of ns which are not in the new root
        VarSet nsrem = ns / grm().OR(maxalpha).vars();
    //  cout << "nsrem:" << nsrem << endl;
        set<DEdge> subTree;
        // for each variable in ns that is not in the root clique
        for( VarSet::const_iterator n = nsrem.begin(); n != nsrem.end(); n++ ) {
            // find first occurence of *n in the tree, which is closest to the root
            size_t e = 0;
            for( ; e != newTree.size(); e++ ) {
                if( grm().OR(newTree[e].n2).vars() && *n )
                    break;
            }
            assert( e != newTree.size() );

            // track-back path to root and add edges to subTree
            subTree.insert( newTree[e] );
            size_t pos = newTree[e].n1;
            for( ; e > 0; e-- )
                if( newTree[e-1].n2 == pos ) {
                    subTree.insert( newTree[e-1] );
                    pos = newTree[e-1].n1;
                }
        }
        if( PreviousRoot != (size_t)-1 && PreviousRoot != maxalpha) {
            // find first occurence of PreviousRoot in the tree, which is closest to the new root
            size_t e = 0;
            for( ; e != newTree.size(); e++ ) {
                if( newTree[e].n2 == PreviousRoot )
                    break;
            }
            assert( e != newTree.size() );

            // track-back path to root and add edges to subTree
            subTree.insert( newTree[e] );
            size_t pos = newTree[e].n1;
            for( ; e > 0; e-- )
                if( newTree[e-1].n2 == pos ) {
                    subTree.insert( newTree[e-1] );
                    pos = newTree[e-1].n1;
                }
        }
    //  cout << "subTree: " << endl;
    //  for( set<DEdge>::const_iterator sTi = subTree.begin(); sTi != subTree.end(); sTi++ )
    //      cout << grm().OR(sTi->n1).vars() << "->" << grm().OR(sTi->n2).vars() << ",  ";
    //  cout << endl;

        // Resulting Tree is a reordered copy of newTree
        // First add edges in subTree to Tree
        Tree.clear();
        for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            if( subTree.count( *e ) ) {
                Tree.push_back( *e );
    //          cout << grm().OR(e->n1).vars() << "->" << grm().OR(e->n2).vars() << ",  ";
            }
    //  cout << endl;
        // Then add edges pointing away from nsrem
        // FIXME
    /*  for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            for( set<DEdge>::const_iterator sTi = subTree.begin(); sTi != subTree.end(); sTi++ )
                if( *e != *sTi ) {
                    if( e->n1 == sTi->n1 || e->n1 == sTi->n2 ||
                        e->n2 == sTi->n1 || e->n2 == sTi->n2 ) {
                        Tree.push_back( *e );
    //                  cout << grm().OR(e->n1).vars() << "->" << grm().OR(e->n2).vars() << ",  ";
                    }
                }*/
        // FIXME
    /*  for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            if( find( Tree.begin(), Tree.end(), *e) == Tree.end() ) {
                bool found = false;
                for( VarSet::const_iterator n = nsrem.begin(); n != nsrem.end(); n++ )
                    if( (grm().OR(e->n1).vars() && *n) ) {
                        found = true;
                        break;
                    }
                if( found ) {
                    Tree.push_back( *e );
                    cout << grm().OR(e->n1).vars() << "->" << grm().OR(e->n2).vars() << ",  ";
                }
            }
        cout << endl;*/
        size_t subTreeSize = Tree.size();
        // Then add remaining edges
        for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            if( find( Tree.begin(), Tree.end(), *e ) == Tree.end() )
                Tree.push_back( *e );

        return subTreeSize;
    }